

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::stop(GlobalMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  AccountingTestMemoryAllocator *pAVar3;
  GlobalMemoryAccountant *this_local;
  
  if (this->mallocAllocator_ == (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"GlobalMemoryAccount: Stop called without starting",
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2f7,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)getCurrentMallocAllocator();
  if (pAVar3 != this->mallocAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fa,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)getCurrentNewAllocator();
  if (pAVar3 != this->newAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fd,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)getCurrentNewArrayAllocator();
  if (pAVar3 != this->newArrayAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x300,pTVar2);
  }
  restoreMemoryAllocators(this);
  return;
}

Assistant:

void GlobalMemoryAccountant::stop()
{
    if (mallocAllocator_ == NULLPTR)
      FAIL("GlobalMemoryAccount: Stop called without starting");

    if (getCurrentMallocAllocator() != mallocAllocator_)
        FAIL("GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory");

    if (getCurrentNewAllocator() != newAllocator_)
        FAIL("GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory");

    if (getCurrentNewArrayAllocator() != newArrayAllocator_)
        FAIL("GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory");

    restoreMemoryAllocators();
}